

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O2

int xmlTextWriterOutputNSDecl(xmlTextWriterPtr writer)

{
  int iVar1;
  xmlLinkPtr lk;
  undefined8 *puVar2;
  xmlChar *content;
  xmlChar *name;
  int iVar3;
  
  iVar3 = 0;
  while( true ) {
    do {
      iVar1 = xmlListEmpty(writer->nsstack);
      if (iVar1 != 0) {
        return iVar3;
      }
      lk = xmlListFront(writer->nsstack);
      puVar2 = (undefined8 *)xmlLinkGetData(lk);
      if (puVar2 == (undefined8 *)0x0) {
        content = (xmlChar *)0x0;
        name = (xmlChar *)0x0;
      }
      else {
        content = xmlStrdup((xmlChar *)puVar2[1]);
        name = xmlStrdup((xmlChar *)*puVar2);
      }
      xmlListPopFront(writer->nsstack);
    } while (puVar2 == (undefined8 *)0x0);
    iVar1 = xmlTextWriterWriteAttribute(writer,name,content);
    (*xmlFree)(content);
    (*xmlFree)(name);
    if (iVar1 < 0) break;
    iVar3 = iVar3 + iVar1;
  }
  xmlListDelete(writer->nsstack);
  writer->nsstack = (xmlListPtr)0x0;
  return -1;
}

Assistant:

static int
xmlTextWriterOutputNSDecl(xmlTextWriterPtr writer)
{
    xmlLinkPtr lk;
    xmlTextWriterNsStackEntry *np;
    int count;
    int sum;

    sum = 0;
    while (!xmlListEmpty(writer->nsstack)) {
        xmlChar *namespaceURI = NULL;
        xmlChar *prefix = NULL;

        lk = xmlListFront(writer->nsstack);
        np = (xmlTextWriterNsStackEntry *) xmlLinkGetData(lk);

        if (np != 0) {
            namespaceURI = xmlStrdup(np->uri);
            prefix = xmlStrdup(np->prefix);
        }

        xmlListPopFront(writer->nsstack);

        if (np != 0) {
            count = xmlTextWriterWriteAttribute(writer, prefix, namespaceURI);
            xmlFree(namespaceURI);
            xmlFree(prefix);

            if (count < 0) {
                xmlListDelete(writer->nsstack);
                writer->nsstack = NULL;
                return -1;
            }
            sum += count;
        }
    }
    return sum;
}